

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::readLine(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  long *plVar1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  Cell *pCVar7;
  ulong uVar8;
  pointer *ppcVar9;
  pointer *ppcVar10;
  uint Value;
  ulong uVar11;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  vector<char,_std::allocator<char>_> readBuffer;
  allocator_type local_71;
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  uint local_5c;
  vector<char,_std::allocator<char>_> local_58;
  size_t local_38;
  
  requireDStackDepth(this,3,"READ-LINE");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ppcVar9 = &local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppcVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"READ-LINE","");
  GetFileHandle((Forth *)&local_70,(Cell)this,(string *)(ulong)uVar3,(errorCodes)&local_58);
  if ((pointer *)
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar9) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1));
  }
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00,2);
  if (uVar3 == 0) {
    uVar3 = this->True;
    uVar4 = 0;
    Value = 0;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&local_58,(ulong)uVar3 + 2,&local_71);
    lVar5 = *(long *)(*local_70 + -0x18);
    if (*(int *)((long)local_70 + lVar5 + 0x20) == 4) {
      std::ios::clear((int)local_70 + (int)lVar5);
      lVar5 = *(long *)(*local_70 + -0x18);
    }
    std::ios::clear((int)lVar5 + (int)local_70);
    pcVar2 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar1 = local_70;
    std::ios::widen((char)*(undefined8 *)(*local_70 + -0x18) + (char)local_70);
    std::istream::getline((char *)plVar1,(long)pcVar2,(char)uVar3 + '\x01');
    ppcVar9 = (pointer *)
              local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_5c = uVar4;
    sVar6 = strlen(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    uVar8 = sVar6 & 0xffffffff;
    if ((uVar8 == uVar3) && (*(int *)((long)local_70 + *(long *)(*local_70 + -0x18) + 0x20) == 4)) {
      std::ios::clear((int)local_70 + (int)*(long *)(*local_70 + -0x18));
      ppcVar9 = (pointer *)
                local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    uVar3 = local_5c;
    ppcVar10 = ppcVar9;
    if (uVar8 != 0) {
      uVar11 = 0;
      local_38 = sVar6;
      do {
        dataSpaceSet(this,(int)uVar11 + uVar3,*(Char *)((long)ppcVar9 + uVar11));
        uVar11 = uVar11 + 1;
        ppcVar10 = (pointer *)
                   local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        sVar6 = local_38;
      } while (uVar8 != uVar11);
    }
    Value = (uint)sVar6;
    uVar4 = *(uint *)((long)local_70 + *(long *)(*local_70 + -0x18) + 0x20);
    pCVar7 = &this->False;
    if ((uVar4 & 2) == 0) {
      pCVar7 = &this->True;
    }
    if (Value != 0) {
      pCVar7 = &this->True;
    }
    uVar3 = *pCVar7;
    if (ppcVar10 != (pointer *)0x0) {
      operator_delete(ppcVar10,(long)local_58.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppcVar10);
    }
    uVar4 = -(uVar4 & 1) & 0xffffffb9;
  }
  ForthStack<unsigned_int>::setTop(this_00,0,uVar4);
  ForthStack<unsigned_int>::setTop(this_00,1,uVar3);
  ForthStack<unsigned_int>::setTop(this_00,2,Value);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

void readLine() {
	REQUIRE_DSTACK_DEPTH(3, "READ-LINE");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "READ-LINE", errorReadLine);
	auto length = SIZE_T(dStack.getTop(1));
	auto caddr = (dStack.getTop(2));
	Cell ior = 0;
	Cell flag = True;
	Cell u2 = 0;
	if (length > 0) {
		std::vector<char> readBuffer(length+2);
		if(f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		f->clear();
		f->getline(&readBuffer[0], static_cast<std::streamsize>(length+1)); // add termination 0 to char counter
		auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
		if (realLength == (length ) && f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		length = realLength;
		auto infoLength = f->gcount();
		moveIntoDataSpace(caddr, &readBuffer[0], length);
		u2 = static_cast<Cell>(length);
		if (f->rdstate() & std::ios::eofbit && u2==0) {
			flag = False; // EOF
		}
		else {
			flag = True;
		}
		ior = f->bad() ? Cell(errorReadLine) : 0;
	}
	
	dStack.setTop(0, ior);
	dStack.setTop(1, flag);
	dStack.setTop(2, u2);
}